

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# corner_table.cc
# Opt level: O3

bool __thiscall draco::CornerTable::BreakNonManifoldEdges(CornerTable *this)

{
  uint uVar1;
  pointer pIVar2;
  IndexType<unsigned_int,_draco::CornerIndex_tag_type_> IVar3;
  pair<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>,_draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>
  pVar4;
  ulong uVar5;
  pointer pIVar6;
  pointer pIVar7;
  uint uVar8;
  pair<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>,_draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>
  *ppVar9;
  int iVar10;
  ulong uVar11;
  uint uVar12;
  int iVar13;
  uint uVar14;
  ulong uVar15;
  vector<std::pair<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>,_draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>,_std::allocator<std::pair<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>,_draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>_>
  sink_vertices;
  pair<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>,_draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>
  local_88;
  uint local_7c;
  pair<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>,_draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>
  *local_78;
  iterator iStack_70;
  pair<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>,_draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>
  *local_68;
  vector<bool,_std::allocator<bool>_> local_58;
  
  local_78 = (pair<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>,_draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>
              *)((ulong)local_78 & 0xffffffffffffff00);
  std::vector<bool,_std::allocator<bool>_>::vector
            (&local_58,
             (long)(int)((ulong)((long)(this->corner_to_vertex_map_).vector_.
                                       super__Vector_base<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>_>_>
                                       ._M_impl.super__Vector_impl_data._M_finish -
                                (long)(this->corner_to_vertex_map_).vector_.
                                      super__Vector_base<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start) >> 2),
             (bool *)&local_78,(allocator_type *)&local_88);
  local_78 = (pair<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>,_draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>
              *)0x0;
  iStack_70._M_current =
       (pair<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>,_draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>
        *)0x0;
  local_68 = (pair<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>,_draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>
              *)0x0;
  pIVar6 = (this->corner_to_vertex_map_).vector_.
           super__Vector_base<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pIVar7 = (this->corner_to_vertex_map_).vector_.
           super__Vector_base<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
LAB_00146864:
  if ((int)((ulong)((long)pIVar7 - (long)pIVar6) >> 2) != 0) {
    local_7c = 0;
    uVar15 = 0;
LAB_0014687e:
    if ((local_58.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
         _M_start.super__Bit_iterator_base._M_p[uVar15 >> 6] >> (uVar15 & 0x3f) & 1) == 0) {
      if (iStack_70._M_current != local_78) {
        iStack_70._M_current = local_78;
      }
      uVar5 = uVar15;
      while( true ) {
        uVar11 = uVar5;
        uVar14 = (uint)uVar11;
        uVar8 = uVar14 - 2;
        if (0x55555555 < (uVar14 + 1) * -0x55555555) {
          uVar8 = uVar14 + 1;
        }
        if ((uVar8 == 0xffffffff) ||
           (uVar8 = (this->opposite_corners_).vector_.
                    super__Vector_base<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start[uVar8].value_, uVar8 == 0xffffffff))
        break;
        uVar12 = uVar8 - 2;
        if (0x55555555 < (uVar8 + 1) * -0x55555555) {
          uVar12 = uVar8 + 1;
        }
        if (((uVar12 == (uint)uVar15) || (uVar12 == 0xffffffff)) ||
           (uVar5 = (ulong)uVar12,
           (local_58.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
            _M_start.super__Bit_iterator_base._M_p[uVar12 >> 6] >> ((ulong)uVar12 & 0x3f) & 1) != 0)
           ) break;
      }
      do {
        iVar10 = (int)uVar11;
        local_58.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
        _M_start.super__Bit_iterator_base._M_p[uVar11 >> 6] =
             local_58.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
             _M_start.super__Bit_iterator_base._M_p[uVar11 >> 6] | 1L << ((byte)uVar11 & 0x3f);
        IVar3.value_ = iVar10 - 2;
        if (0x55555555 < (iVar10 + 1U) * -0x55555555) {
          IVar3.value_ = iVar10 + 1U;
        }
        pIVar6 = (this->corner_to_vertex_map_).vector_.
                 super__Vector_base<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        iVar13 = iVar10 + (int)(uVar11 / 3) * -3;
        uVar8 = iVar10 + -1 + (uint)(iVar13 == 0) * 3;
        if (local_78 != iStack_70._M_current) {
          pIVar2 = (this->opposite_corners_).vector_.
                   super__Vector_base<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          ppVar9 = local_78;
          do {
            if ((ppVar9->first).value_ == pIVar6[IVar3.value_].value_) {
              if (uVar8 == 0xffffffff) {
                uVar12 = 0xffffffff;
              }
              else {
                uVar12 = pIVar2[uVar8].value_;
              }
              uVar1 = (ppVar9->second).value_;
              if (uVar12 != uVar1) {
                if (uVar1 == 0xffffffff) {
                  uVar14 = 0xffffffff;
                }
                else {
                  uVar14 = pIVar2[uVar1].value_;
                }
                if (uVar12 != 0xffffffff) {
                  pIVar2[uVar12].value_ = 0xffffffff;
                }
                if (uVar14 != 0xffffffff) {
                  pIVar2[uVar14].value_ = 0xffffffff;
                }
                pIVar2[uVar8].value_ = 0xffffffff;
                pIVar2[uVar1].value_ = 0xffffffff;
                local_7c = 0xffffff01;
                goto LAB_00146a73;
              }
            }
            ppVar9 = ppVar9 + 1;
          } while (ppVar9 != iStack_70._M_current);
        }
        local_88.first.value_ = pIVar6[uVar8].value_;
        local_88.second.value_ = IVar3.value_;
        if (iStack_70._M_current == local_68) {
          std::
          vector<std::pair<draco::IndexType<unsigned_int,draco::VertexIndex_tag_type_>,draco::IndexType<unsigned_int,draco::CornerIndex_tag_type_>>,std::allocator<std::pair<draco::IndexType<unsigned_int,draco::VertexIndex_tag_type_>,draco::IndexType<unsigned_int,draco::CornerIndex_tag_type_>>>>
          ::
          _M_realloc_insert<std::pair<draco::IndexType<unsigned_int,draco::VertexIndex_tag_type_>,draco::IndexType<unsigned_int,draco::CornerIndex_tag_type_>>const&>
                    ((vector<std::pair<draco::IndexType<unsigned_int,draco::VertexIndex_tag_type_>,draco::IndexType<unsigned_int,draco::CornerIndex_tag_type_>>,std::allocator<std::pair<draco::IndexType<unsigned_int,draco::VertexIndex_tag_type_>,draco::IndexType<unsigned_int,draco::CornerIndex_tag_type_>>>>
                      *)&local_78,iStack_70,&local_88);
        }
        else {
          pVar4.second.value_ = IVar3.value_;
          pVar4.first.value_ = local_88.first.value_;
          *iStack_70._M_current = pVar4;
          iStack_70._M_current = iStack_70._M_current + 1;
        }
        if (iVar13 == 0) {
          uVar8 = iVar10 + 2;
          if (uVar8 == 0xffffffff) goto LAB_00146a2d;
        }
        else {
          uVar8 = iVar10 - 1;
        }
        uVar8 = (this->opposite_corners_).vector_.
                super__Vector_base<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>
                ._M_impl.super__Vector_impl_data._M_start[uVar8].value_;
        if (uVar8 == 0xffffffff) goto LAB_00146a2d;
        uVar8 = ((uVar8 * -0x55555555 < 0x55555556) - 1 | 2) + uVar8;
        uVar11 = (ulong)uVar8;
        if ((uVar8 == uVar14) || (uVar8 == 0xffffffff)) goto LAB_00146a2d;
      } while( true );
    }
    goto LAB_00146a73;
  }
  goto LAB_00146a98;
LAB_00146a2d:
  pIVar6 = (this->corner_to_vertex_map_).vector_.
           super__Vector_base<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
LAB_00146a73:
  uVar14 = (uint)uVar15 + 1;
  uVar15 = (ulong)uVar14;
  pIVar7 = (this->corner_to_vertex_map_).vector_.
           super__Vector_base<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if ((uint)((ulong)((long)pIVar7 - (long)pIVar6) >> 2) <= uVar14) goto code_r0x00146a8d;
  goto LAB_0014687e;
code_r0x00146a8d:
  if ((local_7c & 1) == 0) {
LAB_00146a98:
    if (local_78 !=
        (pair<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>,_draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>
         *)0x0) {
      operator_delete(local_78,(long)local_68 - (long)local_78);
    }
    if (local_58.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
        _M_start.super__Bit_iterator_base._M_p != (_Bit_type *)0x0) {
      operator_delete(local_58.super__Bvector_base<std::allocator<bool>_>._M_impl.
                      super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p,
                      (long)local_58.super__Bvector_base<std::allocator<bool>_>._M_impl.
                            super__Bvector_impl_data._M_end_of_storage -
                      (long)local_58.super__Bvector_base<std::allocator<bool>_>._M_impl.
                            super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p);
    }
    return true;
  }
  goto LAB_00146864;
}

Assistant:

bool CornerTable::BreakNonManifoldEdges() {
  // This function detects and breaks non-manifold edges that are caused by
  // folds in 1-ring neighborhood around a vertex. Non-manifold edges can occur
  // when the 1-ring surface around a vertex self-intersects in a common edge.
  // For example imagine a surface around a pivot vertex 0, where the 1-ring
  // is defined by vertices |1, 2, 3, 1, 4|. The surface passes edge <0, 1>
  // twice which would result in a non-manifold edge that needs to be broken.
  // For now all faces connected to these non-manifold edges are disconnected
  // resulting in open boundaries on the mesh. New vertices will be created
  // automatically for each new disjoint patch in the ComputeVertexCorners()
  // method.
  // Note that all other non-manifold edges are implicitly handled by the
  // function ComputeVertexCorners() that automatically creates new vertices
  // on disjoint 1-ring surface patches.

  std::vector<bool> visited_corners(num_corners(), false);
  std::vector<std::pair<VertexIndex, CornerIndex>> sink_vertices;
  bool mesh_connectivity_updated = false;
  do {
    mesh_connectivity_updated = false;
    for (CornerIndex c(0); c < num_corners(); ++c) {
      if (visited_corners[c.value()]) {
        continue;
      }
      sink_vertices.clear();

      // First swing all the way to find the left-most corner connected to the
      // corner's vertex.
      CornerIndex first_c = c;
      CornerIndex current_c = c;
      CornerIndex next_c;
      while (next_c = SwingLeft(current_c),
             next_c != first_c && next_c != kInvalidCornerIndex &&
                 !visited_corners[next_c.value()]) {
        current_c = next_c;
      }

      first_c = current_c;

      // Swing right from the first corner and check if all visited edges
      // are unique.
      do {
        visited_corners[current_c.value()] = true;
        // Each new edge is defined by the pivot vertex (that is the same for
        // all faces) and by the sink vertex (that is the |next| vertex from the
        // currently processed pivot corner. I.e., each edge is uniquely defined
        // by the sink vertex index.
        const CornerIndex sink_c = Next(current_c);
        const VertexIndex sink_v = corner_to_vertex_map_[sink_c];

        // Corner that defines the edge on the face.
        const CornerIndex edge_corner = Previous(current_c);
        bool vertex_connectivity_updated = false;
        // Go over all processed edges (sink vertices). If the current sink
        // vertex has been already encountered before it may indicate a
        // non-manifold edge that needs to be broken.
        for (auto &&attached_sink_vertex : sink_vertices) {
          if (attached_sink_vertex.first == sink_v) {
            // Sink vertex has been already processed.
            const CornerIndex other_edge_corner = attached_sink_vertex.second;
            const CornerIndex opp_edge_corner = Opposite(edge_corner);

            if (opp_edge_corner == other_edge_corner) {
              // We are closing the loop so no need to change the connectivity.
              continue;
            }

            // Break the connectivity on the non-manifold edge.
            // TODO(ostava): It may be possible to reconnect the faces in a way
            // that the final surface would be manifold.
            const CornerIndex opp_other_edge_corner =
                Opposite(other_edge_corner);
            if (opp_edge_corner != kInvalidCornerIndex) {
              SetOppositeCorner(opp_edge_corner, kInvalidCornerIndex);
            }
            if (opp_other_edge_corner != kInvalidCornerIndex) {
              SetOppositeCorner(opp_other_edge_corner, kInvalidCornerIndex);
            }

            SetOppositeCorner(edge_corner, kInvalidCornerIndex);
            SetOppositeCorner(other_edge_corner, kInvalidCornerIndex);

            vertex_connectivity_updated = true;
            break;
          }
        }
        if (vertex_connectivity_updated) {
          // Because of the updated connectivity, not all corners connected to
          // this vertex have been processed and we need to go over them again.
          // TODO(ostava): This can be optimized as we don't really need to
          // iterate over all corners.
          mesh_connectivity_updated = true;
          break;
        }
        // Insert new sink vertex information <sink vertex index, edge corner>.
        std::pair<VertexIndex, CornerIndex> new_sink_vert;
        new_sink_vert.first = corner_to_vertex_map_[Previous(current_c)];
        new_sink_vert.second = sink_c;
        sink_vertices.push_back(new_sink_vert);

        current_c = SwingRight(current_c);
      } while (current_c != first_c && current_c != kInvalidCornerIndex);
    }
  } while (mesh_connectivity_updated);
  return true;
}